

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  WhereTerm *pWVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  int j;
  int local_34;
  WhereScan *in_stack_fffffffffffffff8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RSI;
  if ((in_R9 == 0) || (in_ECX < 0)) {
    *(undefined1 *)(in_RDI + 3) = 0;
    in_RDI[2] = 0;
  }
  else {
    *(undefined1 *)(in_RDI + 3) =
         *(undefined1 *)(*(long *)(*(long *)(in_R9 + 0x18) + 8) + (long)in_ECX * 0x30 + 0x29);
    local_34 = 0;
    while (*(short *)(*(long *)(in_R9 + 8) + (long)local_34 * 2) != in_ECX) {
      if ((int)(uint)*(ushort *)(in_R9 + 0x58) < local_34) {
        return (WhereTerm *)0x0;
      }
      local_34 = local_34 + 1;
    }
    in_RDI[2] = *(undefined8 *)(*(long *)(in_R9 + 0x40) + (long)local_34 * 8);
  }
  *(undefined4 *)((long)in_RDI + 0x1c) = in_R8D;
  *(undefined4 *)(in_RDI + 4) = 0;
  *(undefined4 *)((long)in_RDI + 0x24) = in_EDX;
  *(int *)(in_RDI + 5) = in_ECX;
  *(undefined1 *)((long)in_RDI + 0x19) = 2;
  *(undefined1 *)((long)in_RDI + 0x1a) = 2;
  pWVar1 = whereScanNext(in_stack_fffffffffffffff8);
  return pWVar1;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  int j;

  /* memset(pScan, 0, sizeof(*pScan)); */
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  if( pIdx && iColumn>=0 ){
    pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
    for(j=0; pIdx->aiColumn[j]!=iColumn; j++){
      if( NEVER(j>pIdx->nColumn) ) return 0;
    }
    pScan->zCollName = pIdx->azColl[j];
  }else{
    pScan->idxaff = 0;
    pScan->zCollName = 0;
  }
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aEquiv[0] = iCur;
  pScan->aEquiv[1] = iColumn;
  pScan->nEquiv = 2;
  pScan->iEquiv = 2;
  return whereScanNext(pScan);
}